

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomUI::read(DomUI *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomWidget *this_00;
  DomLayoutDefault *this_01;
  DomLayoutFunction *this_02;
  DomCustomWidgets *this_03;
  DomTabStops *this_04;
  DomIncludes *this_05;
  DomResources *this_06;
  DomConnections *this_07;
  DomDesignerData *this_08;
  DomSlots *this_09;
  DomButtonGroups *this_10;
  size_t sVar3;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  long lVar4;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_11;
  QXmlStreamAttribute *pQVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  QStringView other_02;
  QStringView other_03;
  QStringView other_04;
  QStringView other_05;
  QStringView other_06;
  QStringView other_07;
  QStringView other_08;
  QStringView other_09;
  QStringView other_10;
  QStringView other_11;
  QStringView other_12;
  QStringView other_13;
  QStringView other_14;
  QStringView other_15;
  QStringView other_16;
  QArrayDataPointer<char16_t> local_b0;
  char *local_98;
  QArrayDataPointer<char16_t> local_90;
  QStringView local_78;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_11 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar5 = local_50.ptr;
  for (lVar4 = 0; local_50.size * 0x68 != lVar4; lVar4 = lVar4 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar5 + 8);
    local_68.m_size = *(qsizetype *)(pQVar5 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"version",7);
    local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    if (bVar1) {
      local_90.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
      local_90.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
      QStringView::toString((QString *)&local_b0,(QStringView *)&local_90);
      setAttributeVersion(this,(QString *)&local_b0);
LAB_0014b77f:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"language",8);
      local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_90.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_90.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        QStringView::toString((QString *)&local_b0,(QStringView *)&local_90);
        setAttributeLanguage(this,(QString *)&local_b0);
        goto LAB_0014b77f;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"displayname",0xb);
      local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_90.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_90.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        QStringView::toString((QString *)&local_b0,(QStringView *)&local_90);
        setAttributeDisplayname(this,(QString *)&local_b0);
        goto LAB_0014b77f;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"idbasedtr",9);
      local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_90.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_90.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"true",4);
        local_78.m_data = (storage_type_conflict *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
        bVar1 = comparesEqual((QStringView *)&local_90,&local_78);
        this->m_attr_idbasedtr = bVar1;
        this->m_has_attr_idbasedtr = true;
        goto LAB_0014b77f;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"connectslotsbyname",0x12);
      local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_90.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
        local_90.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"true",4);
        local_78.m_data = (storage_type_conflict *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
        bVar1 = comparesEqual((QStringView *)&local_90,&local_78);
        this->m_attr_connectslotsbyname = bVar1;
        this->m_has_attr_connectslotsbyname = true;
        goto LAB_0014b77f;
      }
      Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"stdsetdef",9);
      local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
      local_90.d = (Data *)CONCAT44(local_b0.size._4_4_,(undefined4)local_b0.size);
      bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_b0.d._0_4_ = (undefined4)*(undefined8 *)(local_50.ptr + lVar4 + 0x58);
        local_b0.d._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_50.ptr + lVar4 + 0x58) >> 0x20)
        ;
        local_b0.ptr._0_4_ = (undefined4)*(undefined8 *)(local_50.ptr + lVar4 + 0x50);
        local_b0.ptr._4_4_ =
             (undefined4)((ulong)*(undefined8 *)(local_50.ptr + lVar4 + 0x50) >> 0x20);
        iVar2 = QStringView::toInt((QStringView *)&local_b0,(bool *)0x0,10);
        this->m_attr_stdsetdef = iVar2;
        this->m_has_attr_stdsetdef = true;
      }
      else {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"stdSetDef",9);
        local_90.ptr = (char16_t *)CONCAT44(local_b0.ptr._4_4_,local_b0.ptr._0_4_);
        local_90.d = (Data *)CONCAT44(local_b0.size._4_4_,(undefined4)local_b0.size);
        bVar1 = comparesEqual(&local_68,(QStringView *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        if (!bVar1) {
          local_90.d = (Data *)0x15;
          local_90.ptr = L"Unexpected attribute ";
          local_90.size = (qsizetype)&local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    ((QString *)&local_b0,
                     (QStringBuilder<QLatin1String,_const_QStringView_&> *)&local_90);
          QXmlStreamReader::raiseError((QString *)this_11);
          goto LAB_0014b77f;
        }
        local_b0.d._0_4_ = (undefined4)*(undefined8 *)(local_50.ptr + lVar4 + 0x58);
        local_b0.d._4_4_ = (undefined4)((ulong)*(undefined8 *)(local_50.ptr + lVar4 + 0x58) >> 0x20)
        ;
        local_b0.ptr._0_4_ = (undefined4)*(undefined8 *)(local_50.ptr + lVar4 + 0x50);
        local_b0.ptr._4_4_ =
             (undefined4)((ulong)*(undefined8 *)(local_50.ptr + lVar4 + 0x50) >> 0x20);
        iVar2 = QStringView::toInt((QStringView *)&local_b0,(bool *)0x0,10);
        this->m_attr_stdSetDef = iVar2;
        this->m_has_attr_stdSetDef = true;
      }
    }
    pQVar5 = pQVar5 + 0x68;
  }
LAB_0014b8d4:
  while( true ) {
    bVar1 = QXmlStreamReader::hasError(this_11);
    if (bVar1) goto LAB_0014c0ba;
    iVar2 = QXmlStreamReader::readNext();
    if (iVar2 == 4) break;
    if (iVar2 == 5) {
LAB_0014c0ba:
      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return *(long *)(in_FS_OFFSET + 0x28);
    }
  }
  local_68.m_size = -0x5555555555555556;
  local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
  local_68 = (QStringView)QXmlStreamReader::name();
  Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"author",6);
  other.m_data._4_4_ = local_b0.ptr._4_4_;
  other.m_data._0_4_ = local_b0.ptr._0_4_;
  other.m_size._4_4_ = local_b0.size._4_4_;
  other.m_size._0_4_ = (undefined4)local_b0.size;
  iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  if (iVar2 == 0) {
    QXmlStreamReader::readElementText(&local_b0,this_11,0);
    setElementAuthor(this,(QString *)&local_b0);
  }
  else {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"comment",7);
    other_00.m_data._4_4_ = local_b0.ptr._4_4_;
    other_00.m_data._0_4_ = local_b0.ptr._0_4_;
    other_00.m_size._4_4_ = local_b0.size._4_4_;
    other_00.m_size._0_4_ = (undefined4)local_b0.size;
    iVar2 = QStringView::compare(&local_68,other_00,CaseInsensitive);
    if (iVar2 == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    }
    else {
      Qt::Literals::StringLiterals::operator____s((QString *)&local_90,L"legal",5);
      other_01.m_data = local_90.ptr;
      other_01.m_size = local_90.size;
      iVar2 = QStringView::compare(&local_68,other_01,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (iVar2 != 0) {
        Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"exportmacro",0xb);
        other_02.m_data._4_4_ = local_b0.ptr._4_4_;
        other_02.m_data._0_4_ = local_b0.ptr._0_4_;
        other_02.m_size._4_4_ = local_b0.size._4_4_;
        other_02.m_size._0_4_ = (undefined4)local_b0.size;
        iVar2 = QStringView::compare(&local_68,other_02,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_b0,this_11,0);
          setElementExportMacro(this,(QString *)&local_b0);
        }
        else {
          Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"class",5);
          other_03.m_data._4_4_ = local_b0.ptr._4_4_;
          other_03.m_data._0_4_ = local_b0.ptr._0_4_;
          other_03.m_size._4_4_ = local_b0.size._4_4_;
          other_03.m_size._0_4_ = (undefined4)local_b0.size;
          iVar2 = QStringView::compare(&local_68,other_03,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_b0,this_11,0);
            setElementClass(this,(QString *)&local_b0);
          }
          else {
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"widget",6);
            other_04.m_data._4_4_ = local_b0.ptr._4_4_;
            other_04.m_data._0_4_ = local_b0.ptr._0_4_;
            other_04.m_size._4_4_ = local_b0.size._4_4_;
            other_04.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_04,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_00 = (DomWidget *)operator_new(0x160);
              memset(this_00,0,0x160);
              DomWidget::read(this_00,__fd,__buf_00,sVar3);
              setElementWidget(this,this_00);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"layoutdefault",0xd);
            other_05.m_data._4_4_ = local_b0.ptr._4_4_;
            other_05.m_data._0_4_ = local_b0.ptr._0_4_;
            other_05.m_size._4_4_ = local_b0.size._4_4_;
            other_05.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_05,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_01 = (DomLayoutDefault *)operator_new(0x10);
              this_01->m_attr_spacing = 0;
              this_01->m_has_attr_spacing = false;
              *(undefined3 *)&this_01->field_0x5 = 0;
              this_01->m_attr_margin = 0;
              this_01->m_has_attr_margin = false;
              *(undefined3 *)&this_01->field_0xd = 0;
              DomLayoutDefault::read(this_01,__fd,__buf_01,sVar3);
              setElementLayoutDefault(this,this_01);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"layoutfunction",0xe);
            other_06.m_data._4_4_ = local_b0.ptr._4_4_;
            other_06.m_data._0_4_ = local_b0.ptr._0_4_;
            other_06.m_size._4_4_ = local_b0.size._4_4_;
            other_06.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_06,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_02 = (DomLayoutFunction *)operator_new(0x40);
              (this_02->m_attr_spacing).d.d = (Data *)0x0;
              (this_02->m_attr_spacing).d.ptr = (char16_t *)0x0;
              (this_02->m_attr_spacing).d.size = 0;
              *(undefined8 *)&this_02->m_has_attr_spacing = 0;
              (this_02->m_attr_margin).d.d = (Data *)0x0;
              (this_02->m_attr_margin).d.ptr = (char16_t *)0x0;
              (this_02->m_attr_margin).d.size = 0;
              *(undefined8 *)&this_02->m_has_attr_margin = 0;
              DomLayoutFunction::read(this_02,__fd,__buf_02,sVar3);
              setElementLayoutFunction(this,this_02);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"pixmapfunction",0xe);
            other_07.m_data._4_4_ = local_b0.ptr._4_4_;
            other_07.m_data._0_4_ = local_b0.ptr._0_4_;
            other_07.m_size._4_4_ = local_b0.size._4_4_;
            other_07.m_size._0_4_ = (undefined4)local_b0.size;
            iVar2 = QStringView::compare(&local_68,other_07,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(&local_b0,this_11,0);
              setElementPixmapFunction(this,(QString *)&local_b0);
              goto LAB_0014bdbd;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"customwidgets",0xd);
            other_08.m_data._4_4_ = local_b0.ptr._4_4_;
            other_08.m_data._0_4_ = local_b0.ptr._0_4_;
            other_08.m_size._4_4_ = local_b0.size._4_4_;
            other_08.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_08,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_03 = (DomCustomWidgets *)operator_new(0x20);
              *(undefined8 *)this_03 = 0;
              (this_03->m_customWidget).d.d = (Data *)0x0;
              (this_03->m_customWidget).d.ptr = (DomCustomWidget **)0x0;
              (this_03->m_customWidget).d.size = 0;
              DomCustomWidgets::read(this_03,__fd,__buf_03,sVar3);
              setElementCustomWidgets(this,this_03);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"tabstops",8);
            other_09.m_data._4_4_ = local_b0.ptr._4_4_;
            other_09.m_data._0_4_ = local_b0.ptr._0_4_;
            other_09.m_size._4_4_ = local_b0.size._4_4_;
            other_09.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_09,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_04 = (DomTabStops *)operator_new(0x20);
              *(undefined8 *)this_04 = 0;
              (this_04->m_tabStop).d.d = (Data *)0x0;
              (this_04->m_tabStop).d.ptr = (QString *)0x0;
              (this_04->m_tabStop).d.size = 0;
              DomTabStops::read(this_04,__fd,__buf_04,sVar3);
              setElementTabStops(this,this_04);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"images",6);
            other_10.m_data._4_4_ = local_b0.ptr._4_4_;
            other_10.m_data._0_4_ = local_b0.ptr._0_4_;
            other_10.m_size._4_4_ = local_b0.size._4_4_;
            other_10.m_size._0_4_ = (undefined4)local_b0.size;
            iVar2 = QStringView::compare(&local_68,other_10,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              local_b0.d._0_4_ = 2;
              local_b0.d._4_4_ = 0;
              local_b0.ptr._0_4_ = 0;
              local_b0.ptr._4_4_ = 0;
              local_b0.size._0_4_ = 0;
              local_b0.size._4_4_ = 0;
              local_98 = "default";
              QMessageLogger::warning((char *)&local_b0,"Omitting deprecated element <images>.");
              QXmlStreamReader::skipCurrentElement();
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"includes",8);
            other_11.m_data._4_4_ = local_b0.ptr._4_4_;
            other_11.m_data._0_4_ = local_b0.ptr._0_4_;
            other_11.m_size._4_4_ = local_b0.size._4_4_;
            other_11.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_11,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_05 = (DomIncludes *)operator_new(0x20);
              *(undefined8 *)this_05 = 0;
              (this_05->m_include).d.d = (Data *)0x0;
              (this_05->m_include).d.ptr = (DomInclude **)0x0;
              (this_05->m_include).d.size = 0;
              DomIncludes::read(this_05,__fd,__buf_05,sVar3);
              setElementIncludes(this,this_05);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"resources",9);
            other_12.m_data._4_4_ = local_b0.ptr._4_4_;
            other_12.m_data._0_4_ = local_b0.ptr._0_4_;
            other_12.m_size._4_4_ = local_b0.size._4_4_;
            other_12.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_12,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_06 = (DomResources *)operator_new(0x38);
              (this_06->m_attr_name).d.d = (Data *)0x0;
              (this_06->m_attr_name).d.ptr = (char16_t *)0x0;
              (this_06->m_attr_name).d.size = 0;
              this_06->m_has_attr_name = false;
              *(undefined3 *)&this_06->field_0x19 = 0;
              this_06->m_children = 0;
              (this_06->m_include).d.d = (Data *)0x0;
              (this_06->m_include).d.ptr = (DomResource **)0x0;
              (this_06->m_include).d.size = 0;
              DomResources::read(this_06,__fd,__buf_06,sVar3);
              setElementResources(this,this_06);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"connections",0xb);
            other_13.m_data._4_4_ = local_b0.ptr._4_4_;
            other_13.m_data._0_4_ = local_b0.ptr._0_4_;
            other_13.m_size._4_4_ = local_b0.size._4_4_;
            other_13.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_13,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_07 = (DomConnections *)operator_new(0x20);
              *(undefined8 *)this_07 = 0;
              (this_07->m_connection).d.d = (Data *)0x0;
              (this_07->m_connection).d.ptr = (DomConnection **)0x0;
              (this_07->m_connection).d.size = 0;
              DomConnections::read(this_07,__fd,__buf_07,sVar3);
              setElementConnections(this,this_07);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"designerdata",0xc);
            other_14.m_data._4_4_ = local_b0.ptr._4_4_;
            other_14.m_data._0_4_ = local_b0.ptr._0_4_;
            other_14.m_size._4_4_ = local_b0.size._4_4_;
            other_14.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_14,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_08 = (DomDesignerData *)operator_new(0x20);
              *(undefined8 *)this_08 = 0;
              (this_08->m_property).d.d = (Data *)0x0;
              (this_08->m_property).d.ptr = (DomProperty **)0x0;
              (this_08->m_property).d.size = 0;
              DomDesignerData::read(this_08,__fd,__buf_08,sVar3);
              setElementDesignerdata(this,this_08);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"slots",5);
            other_15.m_data._4_4_ = local_b0.ptr._4_4_;
            other_15.m_data._0_4_ = local_b0.ptr._0_4_;
            other_15.m_size._4_4_ = local_b0.size._4_4_;
            other_15.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_15,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_09 = (DomSlots *)operator_new(0x38);
              *(undefined8 *)this_09 = 0;
              (this_09->m_signal).d.d = (Data *)0x0;
              (this_09->m_signal).d.ptr = (QString *)0x0;
              (this_09->m_signal).d.size = 0;
              (this_09->m_slot).d.d = (Data *)0x0;
              (this_09->m_slot).d.ptr = (QString *)0x0;
              (this_09->m_slot).d.size = 0;
              DomSlots::read(this_09,__fd,__buf_09,sVar3);
              setElementSlots(this,this_09);
              goto LAB_0014b8d4;
            }
            Qt::Literals::StringLiterals::operator____s((QString *)&local_b0,L"buttongroups",0xc);
            other_16.m_data._4_4_ = local_b0.ptr._4_4_;
            other_16.m_data._0_4_ = local_b0.ptr._0_4_;
            other_16.m_size._4_4_ = local_b0.size._4_4_;
            other_16.m_size._0_4_ = (undefined4)local_b0.size;
            sVar3 = 0;
            iVar2 = QStringView::compare(&local_68,other_16,CaseInsensitive);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
            if (iVar2 == 0) {
              this_10 = (DomButtonGroups *)operator_new(0x20);
              *(undefined8 *)this_10 = 0;
              (this_10->m_buttonGroup).d.d = (Data *)0x0;
              (this_10->m_buttonGroup).d.ptr = (DomButtonGroup **)0x0;
              (this_10->m_buttonGroup).d.size = 0;
              DomButtonGroups::read(this_10,__fd,__buf_10,sVar3);
              setElementButtonGroups(this,this_10);
              goto LAB_0014b8d4;
            }
            local_90.d = (Data *)0x13;
            local_90.ptr = L"Unexpected element ";
            local_90.size = (qsizetype)&local_68;
            QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                      ((QString *)&local_b0,
                       (QStringBuilder<QLatin1String,_const_QStringView_&> *)&local_90);
            QXmlStreamReader::raiseError((QString *)this_11);
          }
        }
        goto LAB_0014bdbd;
      }
    }
    QXmlStreamReader::readElementText(&local_b0,this_11,0);
    setElementComment(this,(QString *)&local_b0);
  }
LAB_0014bdbd:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  goto LAB_0014b8d4;
}

Assistant:

void DomUI::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"version"_s) {
            setAttributeVersion(attribute.value().toString());
            continue;
        }
        if (name == u"language"_s) {
            setAttributeLanguage(attribute.value().toString());
            continue;
        }
        if (name == u"displayname"_s) {
            setAttributeDisplayname(attribute.value().toString());
            continue;
        }
        if (name == u"idbasedtr"_s) {
            setAttributeIdbasedtr(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"connectslotsbyname"_s) {
            setAttributeConnectslotsbyname(attribute.value() == u"true"_s);
            continue;
        }
        if (name == u"stdsetdef"_s) {
            setAttributeStdsetdef(attribute.value().toInt());
            continue;
        }
        if (name == u"stdSetDef"_s) {
            setAttributeStdSetDef(attribute.value().toInt());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"author"_s, Qt::CaseInsensitive)) {
                setElementAuthor(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"comment"_s, Qt::CaseInsensitive)
                    || !tag.compare(u"legal"_s, Qt::CaseInsensitive)) {
                setElementComment(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"exportmacro"_s, Qt::CaseInsensitive)) {
                setElementExportMacro(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layoutdefault"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutDefault();
                v->read(reader);
                setElementLayoutDefault(v);
                continue;
            }
            if (!tag.compare(u"layoutfunction"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayoutFunction();
                v->read(reader);
                setElementLayoutFunction(v);
                continue;
            }
            if (!tag.compare(u"pixmapfunction"_s, Qt::CaseInsensitive)) {
                setElementPixmapFunction(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"customwidgets"_s, Qt::CaseInsensitive)) {
                auto *v = new DomCustomWidgets();
                v->read(reader);
                setElementCustomWidgets(v);
                continue;
            }
            if (!tag.compare(u"tabstops"_s, Qt::CaseInsensitive)) {
                auto *v = new DomTabStops();
                v->read(reader);
                setElementTabStops(v);
                continue;
            }
            if (!tag.compare(u"images"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <images>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"includes"_s, Qt::CaseInsensitive)) {
                auto *v = new DomIncludes();
                v->read(reader);
                setElementIncludes(v);
                continue;
            }
            if (!tag.compare(u"resources"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResources();
                v->read(reader);
                setElementResources(v);
                continue;
            }
            if (!tag.compare(u"connections"_s, Qt::CaseInsensitive)) {
                auto *v = new DomConnections();
                v->read(reader);
                setElementConnections(v);
                continue;
            }
            if (!tag.compare(u"designerdata"_s, Qt::CaseInsensitive)) {
                auto *v = new DomDesignerData();
                v->read(reader);
                setElementDesignerdata(v);
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"buttongroups"_s, Qt::CaseInsensitive)) {
                auto *v = new DomButtonGroups();
                v->read(reader);
                setElementButtonGroups(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}